

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::ComputeFunctionToEntryPointMapping(ValidationState_t *this)

{
  size_t *this_00;
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  reference puVar2;
  reference pvVar3;
  mapped_type *this_02;
  Function *this_03;
  reference puVar4;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar5;
  uint local_12c;
  iterator iStack_128;
  uint32_t new_call;
  iterator __end5;
  iterator __begin5;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range5;
  Function *called_func;
  value_type local_b4;
  undefined1 local_b0 [4];
  uint32_t called_func_id;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> call_stack;
  const_iterator cStack_28;
  uint32_t entry_point;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  ValidationState_t *this_local;
  
  this_01 = entry_points(this);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
  cStack_28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd8), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    call_stack.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node._4_4_ = *puVar2;
    std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
    stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
              ((stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)
               &visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_b0
              );
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &visited._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (value_type *)
               ((long)&call_stack.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node + 4));
    while (bVar1 = std::
                   stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                   empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = &visited._M_t._M_impl.super__Rb_tree_header._M_node_count;
      pvVar3 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
               top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   this_00);
      local_b4 = *pvVar3;
      std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 this_00);
      pVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_b0,&local_b4);
      if (((pVar5.second ^ 0xffU) & 1) == 0) {
        this_02 = std::
                  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[](&this->function_to_entry_points_,&local_b4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (this_02,(value_type *)
                           ((long)&call_stack.c.
                                   super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node + 4));
        this_03 = function(this,local_b4);
        if (this_03 != (Function *)0x0) {
          val::Function::function_call_targets
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &__begin5,this_03);
          __end5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&__begin5);
          iStack_128 = std::
                       set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                       end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__begin5);
          while (bVar1 = std::operator!=(&__end5,&stack0xfffffffffffffed8), bVar1) {
            puVar4 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end5);
            local_12c = *puVar4;
            std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                      ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_12c);
            std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end5);
          }
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &__begin5);
        }
      }
    }
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_b0
              );
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void ValidationState_t::ComputeFunctionToEntryPointMapping() {
  for (const uint32_t entry_point : entry_points()) {
    std::stack<uint32_t> call_stack;
    std::set<uint32_t> visited;
    call_stack.push(entry_point);
    while (!call_stack.empty()) {
      const uint32_t called_func_id = call_stack.top();
      call_stack.pop();
      if (!visited.insert(called_func_id).second) continue;

      function_to_entry_points_[called_func_id].push_back(entry_point);

      const Function* called_func = function(called_func_id);
      if (called_func) {
        // Other checks should error out on this invalid SPIR-V.
        for (const uint32_t new_call : called_func->function_call_targets()) {
          call_stack.push(new_call);
        }
      }
    }
  }
}